

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oonf_packet_socket.c
# Opt level: O2

int oonf_packet_send_managed_multicast
              (oonf_packet_managed *managed,void *data,size_t length,int af_type)

{
  oonf_packet_socket *poVar1;
  int iVar2;
  int *piVar3;
  
  if (af_type == 10) {
    poVar1 = &managed->multicast_v6;
  }
  else {
    if (af_type != 2) {
      piVar3 = __errno_location();
      *piVar3 = 0;
      return 1;
    }
    poVar1 = &managed->multicast_v4;
  }
  iVar2 = oonf_packet_send_managed(managed,&poVar1->local_socket,data,length);
  return iVar2;
}

Assistant:

int
oonf_packet_send_managed_multicast(struct oonf_packet_managed *managed, const void *data, size_t length, int af_type) {
  if (af_type == AF_INET) {
    return oonf_packet_send_managed(managed, &managed->multicast_v4.local_socket, data, length);
  }
  else if (af_type == AF_INET6) {
    return oonf_packet_send_managed(managed, &managed->multicast_v6.local_socket, data, length);
  }
  errno = 0;
  return 1;
}